

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O2

int IDAGetJacNumSteps(void *ida_mem,long *nst_J)

{
  int iVar1;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  IDALsMem local_18;
  IDAMem local_10;
  
  iVar1 = idaLs_AccessLMem(ida_mem,"IDAGetJacNumSteps",&local_10,&local_18);
  if (iVar1 == 0) {
    *nst_J = local_18->nstlj;
  }
  return iVar1;
}

Assistant:

int IDAGetJacNumSteps(void* ida_mem, long int* nst_J)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure; set output and return */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return retval; }
  *nst_J = idals_mem->nstlj;
  return IDALS_SUCCESS;
}